

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

size_t __thiscall ON_FixedSizePool::SizeOfPool(ON_FixedSizePool *this)

{
  undefined8 *puVar1;
  size_t sVar2;
  undefined8 *local_28;
  void *blk;
  void *next;
  size_t element_count;
  ON_FixedSizePool *this_local;
  
  next = (void *)0x0;
  local_28 = (undefined8 *)this->m_first_block;
  while (local_28 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_28;
    sVar2 = BlockElementCapacity(this,local_28);
    next = (void *)(sVar2 + (long)next);
    local_28 = puVar1;
  }
  return (long)next * this->m_sizeof_element;
}

Assistant:

size_t ON_FixedSizePool::SizeOfPool() const
{
  size_t element_count = 0;
  void* next = m_first_block;
  for (void* blk = next; nullptr != blk; blk = next)
  {
    next = *((void**)blk);
    element_count += BlockElementCapacity(blk);
  }
  return element_count * m_sizeof_element;
}